

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O0

LogSample __thiscall
MT32Emu::LA32WaveGenerator::getOutputLogSample(LA32WaveGenerator *this,bool first)

{
  bool bVar1;
  LogSample *local_38;
  LogSample *local_30;
  bool first_local;
  LA32WaveGenerator *this_local;
  
  bVar1 = isActive(this);
  if (bVar1) {
    bVar1 = isPCMWave(this);
    if (bVar1) {
      if (first) {
        local_30 = &this->firstPCMLogSample;
      }
      else {
        local_30 = &this->secondPCMLogSample;
      }
      this_local = *(LA32WaveGenerator **)local_30;
    }
    else {
      if (first) {
        local_38 = &this->squareLogSample;
      }
      else {
        local_38 = &this->resonanceLogSample;
      }
      this_local = *(LA32WaveGenerator **)local_38;
    }
  }
  else {
    this_local = (LA32WaveGenerator *)0xffff;
  }
  return (LogSample)this_local;
}

Assistant:

LogSample LA32WaveGenerator::getOutputLogSample(const bool first) const {
	if (!isActive()) {
		return SILENCE;
	}
	if (isPCMWave()) {
		return first ? firstPCMLogSample : secondPCMLogSample;
	}
	return first ? squareLogSample : resonanceLogSample;
}